

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O1

PClassActor * __thiscall PClassActor::GetReplacement(PClassActor *this,bool lookskill)

{
  PClassActor *pPVar1;
  PClass *pPVar2;
  PClassActor *pPVar3;
  undefined7 in_register_00000031;
  undefined1 auVar4 [4];
  long lVar5;
  undefined1 local_44 [4];
  FName local_40;
  FName local_3c;
  FName local_38;
  FName local_34;
  FName local_30;
  int local_2c;
  
  auVar4 = (undefined1  [4])0x0;
  if (((int)CONCAT71(in_register_00000031,lookskill) != 0) &&
     ((uint)gameskill.Value < AllSkills.Count)) {
    local_2c = (this->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.TypeName.
               Index;
    FSkillInfo::GetReplacement((FSkillInfo *)local_44,&AllSkills.Array[gameskill.Value].Name);
    auVar4 = local_44;
    lVar5 = (long)(int)local_44;
    if (lVar5 != 0) {
      local_30.Index = (int)local_44;
      pPVar2 = PClass::FindClass(&local_30);
      if (pPVar2 == (PClass *)0x0) {
        lookskill = false;
        Printf("Warning: incorrect actor name in definition of skill %s: \nclass %s is replaced by non-existent class %s\nSkill replacement will be ignored for this actor.\n"
               ,FName::NameData.NameArray[AllSkills.Array[gameskill.Value].Name.Index].Text,
               FName::NameData.NameArray
               [(this->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.TypeName.
                Index].Text,FName::NameData.NameArray[lVar5].Text);
        local_34.Index =
             (this->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.TypeName.Index;
        local_38.Index = 0;
        FSkillInfo::SetReplacement(AllSkills.Array + gameskill.Value,&local_34,&local_38);
        local_3c.Index = (int)auVar4;
        local_40.Index = 0;
        FSkillInfo::SetReplacedBy(AllSkills.Array + gameskill.Value,&local_3c,&local_40);
        auVar4 = (undefined1  [4])0x0;
      }
    }
  }
  pPVar1 = this->Replacement;
  pPVar3 = this;
  if (((~lookskill | auVar4 == (undefined1  [4])0x0) & pPVar1 == (PClassActor *)0x0) == 0) {
    this->Replacement = (PClassActor *)0x0;
    pPVar3 = pPVar1;
    if (lookskill == true && auVar4 != (undefined1  [4])0x0) {
      local_44 = auVar4;
      pPVar2 = PClass::FindClass((FName *)local_44);
      pPVar3 = dyn_cast<PClassActor>((DObject *)pPVar2);
    }
    pPVar3 = GetReplacement(pPVar3,false);
    this->Replacement = pPVar1;
  }
  return pPVar3;
}

Assistant:

PClassActor *PClassActor::GetReplacement(bool lookskill)
{
	FName skillrepname;
	
	if (lookskill && AllSkills.Size() > (unsigned)gameskill)
	{
		skillrepname = AllSkills[gameskill].GetReplacement(TypeName);
		if (skillrepname != NAME_None && PClass::FindClass(skillrepname) == NULL)
		{
			Printf("Warning: incorrect actor name in definition of skill %s: \n"
				   "class %s is replaced by non-existent class %s\n"
				   "Skill replacement will be ignored for this actor.\n", 
				   AllSkills[gameskill].Name.GetChars(), 
				   TypeName.GetChars(), skillrepname.GetChars());
			AllSkills[gameskill].SetReplacement(TypeName, NAME_None);
			AllSkills[gameskill].SetReplacedBy(skillrepname, NAME_None);
			lookskill = false; skillrepname = NAME_None;
		}
	}
	if (Replacement == NULL && (!lookskill || skillrepname == NAME_None))
	{
		return this;
	}
	// The Replacement field is temporarily NULLed to prevent
	// potential infinite recursion.
	PClassActor *savedrep = Replacement;
	Replacement = NULL;
	PClassActor *rep = savedrep;
	// Handle skill-based replacement here. It has precedence on DECORATE replacement
	// in that the skill replacement is applied first, followed by DECORATE replacement
	// on the actor indicated by the skill replacement.
	if (lookskill && (skillrepname != NAME_None))
	{
		rep = PClass::FindActor(skillrepname);
	}
	// Now handle DECORATE replacement chain
	// Skill replacements are not recursive, contrarily to DECORATE replacements
	rep = rep->GetReplacement(false);
	// Reset the temporarily NULLed field
	Replacement = savedrep;
	return rep;
}